

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O3

uint32_t WriteBinaryMaterial(aiMaterial *mat)

{
  uint32_t uVar1;
  undefined8 in_RAX;
  long lVar2;
  ulong uVar3;
  uint32_t n;
  uint32_t t;
  undefined4 local_28;
  uint local_24;
  
  _local_28 = CONCAT44((uint)((ulong)in_RAX >> 0x20),0x123d);
  fwrite(&local_28,4,1,(FILE *)out);
  fwrite(&local_28,4,1,(FILE *)out);
  lVar2 = ftell((FILE *)out);
  _local_28 = CONCAT44(mat->mNumProperties,local_28);
  fwrite(&local_24,4,1,(FILE *)out);
  if (mat->mNumProperties == 0) {
    n = 4;
  }
  else {
    n = 4;
    uVar3 = 0;
    do {
      uVar1 = WriteBinaryMaterialProperty(mat->mProperties[uVar3]);
      n = n + uVar1 + 8;
      uVar3 = uVar3 + 1;
    } while (uVar3 < mat->mNumProperties);
  }
  ChangeInteger((int)lVar2 - 4,n);
  return n;
}

Assistant:

uint32_t WriteBinaryMaterial(const aiMaterial* mat)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AIMATERIAL);

	len += Write<unsigned int>(mat->mNumProperties);
	for (unsigned int i = 0; i < mat->mNumProperties;++i) {
		len += WriteBinaryMaterialProperty(mat->mProperties[i])+8;
	}

	ChangeInteger(old,len);
	return len;
}